

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O3

void fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(uint64_t *output,uint64_t *t1)

{
  int iVar1;
  fe_t_conflict2 acc;
  fe_t_conflict2 t3;
  fe_t_conflict2 t13;
  uint64_t auStack_f8 [8];
  uint64_t local_b8 [8];
  uint64_t local_78 [9];
  
  fiat_id_tc26_gost_3410_2012_512_paramSetB_square(auStack_f8,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(local_b8,t1,auStack_f8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(local_78,local_b8,auStack_f8);
  iVar1 = 4;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(local_78,local_78,auStack_f8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_square(auStack_f8,t1);
  iVar1 = 0x1f9;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(auStack_f8,auStack_f8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(auStack_f8,auStack_f8,local_b8);
  iVar1 = 5;
  do {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(auStack_f8,auStack_f8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(output,auStack_f8,local_78);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(fe_t output,
                                                          const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t13, t3;

    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t3, t1, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t13, t3, acc);
    for (i = 0; i < 4; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t13, t13, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, t1);
    for (i = 0; i < 505; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(acc, acc, t3);
    for (i = 0; i < 5; i++)
        fiat_id_tc26_gost_3410_2012_512_paramSetB_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(output, acc, t13);
}